

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

AliasRet aa_table(jit_State *J,IRRef ta,IRRef tb)

{
  GCRef *pGVar1;
  uint32_t *puVar2;
  GCRef *pGVar3;
  GCRef *pGVar4;
  byte bVar5;
  byte bVar6;
  
  bVar5 = *(char *)((long)&(&(J->cur).nextgc)[ta].gcptr64 + 5) + 0xaf;
  bVar6 = *(char *)((long)&(&(J->cur).nextgc)[tb].gcptr64 + 5) + 0xaf;
  if (1 < (bVar6 | bVar5)) {
    pGVar4 = &(J->cur).nextgc + ta;
    pGVar1 = &(J->cur).nextgc + tb;
    pGVar3 = pGVar1;
    if ((1 < bVar6) && (pGVar3 = pGVar4, pGVar4 = pGVar1, 1 < bVar5)) {
      return ALIAS_MAY;
    }
    puVar2 = (uint32_t *)(pGVar3 + 1);
    if (puVar2 < pGVar4) {
      do {
        if (((uint)*(uint16_t *)((long)puVar2 + 2) == (uint)((ulong)((long)pGVar3 - (long)J) >> 3))
           && ((byte)(*(char *)((long)puVar2 + 5) + 0xb6U) < 4)) {
          return ALIAS_MAY;
        }
        puVar2 = puVar2 + 2;
      } while (puVar2 < pGVar4);
    }
  }
  return ALIAS_NO;
}

Assistant:

static AliasRet aa_table(jit_State *J, IRRef ta, IRRef tb)
{
  IRIns *taba = IR(ta), *tabb = IR(tb);
  int newa, newb;
  lj_assertJ(ta != tb, "bad usage");
  lj_assertJ(irt_istab(taba->t) && irt_istab(tabb->t), "bad usage");
  /* Disambiguate new allocations. */
  newa = (taba->o == IR_TNEW || taba->o == IR_TDUP);
  newb = (tabb->o == IR_TNEW || tabb->o == IR_TDUP);
  if (newa && newb)
    return ALIAS_NO;  /* Two different allocations never alias. */
  if (newb) {  /* At least one allocation? */
    IRIns *tmp = taba; taba = tabb; tabb = tmp;
  } else if (!newa) {
    return ALIAS_MAY;  /* Anything else: we just don't know. */
  }
  return aa_escape(J, taba, tabb);
}